

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  Mat *this_00;
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint _h;
  _func_int *p_Var14;
  int *piVar15;
  void *pvVar16;
  Allocator *pAVar17;
  size_t sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  int _w;
  Layer *pLVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  undefined4 *puVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  Mat *this_01;
  long lVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  ParamDict pd;
  size_t local_d8;
  Allocator *local_c8;
  int local_bc;
  
  pLVar26 = create_layer(0xe);
  this->flatten = pLVar26;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar25 = cpu_support_x86_f16c();
  if ((iVar25 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var14 = this->_vptr_InnerProduct_x86_avx[-3];
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var14);
  iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var14);
  _h = *(uint *)(&this->field_0xd0 + (long)p_Var14);
  uVar40 = (ulong)(int)_h;
  _w = iVar25 / (int)_h;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((uVar40 & 7) == 0) {
      Mat::reshape((Mat *)&pd,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      lVar27 = 3;
      lVar39 = 4;
      lVar31 = 5;
      lVar28 = 6;
      lVar30 = 7;
      lVar37 = 2;
      lVar34 = 1;
      lVar35 = 0;
      for (uVar32 = 0; (long)(uVar32 | 7) < (long)uVar40; uVar32 = uVar32 + 8) {
        lVar36 = (long)(this->weight_data_tm).w;
        pvVar16 = (this->weight_data_tm).data;
        sVar18 = (this->weight_data_tm).elemsize;
        puVar33 = (undefined4 *)((uVar32 >> 3) * lVar36 * sVar18 + (long)pvVar16);
        lVar38 = (long)local_bc;
        lVar36 = sVar18 * lVar35 * lVar36;
        lVar29 = 0;
        lVar41 = 0;
        for (iVar25 = 0; iVar25 + 7 < _w; iVar25 = iVar25 + 8) {
          auVar6 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar41 + local_d8 * uVar32 * lVar38);
          auVar7 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar34 * lVar38);
          auVar8 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar37 * lVar38);
          auVar9 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar27 * lVar38);
          auVar10 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar39 * lVar38);
          auVar11 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar31 * lVar38);
          auVar12 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar28 * lVar38);
          auVar13 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar41 + local_d8 * lVar30 * lVar38);
          auVar22 = vunpcklps_avx(auVar6,auVar7);
          auVar7 = vunpckhps_avx(auVar6,auVar7);
          auVar6 = vunpcklps_avx(auVar8,auVar9);
          auVar8 = vunpckhps_avx(auVar8,auVar9);
          auVar42 = vunpcklps_avx(auVar10,auVar11);
          auVar9 = vunpckhps_avx(auVar10,auVar11);
          auVar43 = vunpcklps_avx(auVar12,auVar13);
          auVar10 = vunpckhps_avx(auVar12,auVar13);
          auVar11 = vunpcklpd_avx(auVar22,auVar6);
          auVar6 = vunpckhpd_avx(auVar22,auVar6);
          auVar12 = vunpcklpd_avx(auVar7,auVar8);
          auVar7 = vunpckhpd_avx(auVar7,auVar8);
          auVar13 = vunpcklpd_avx(auVar42,auVar43);
          auVar8 = vunpckhpd_avx(auVar42,auVar43);
          auVar22 = vunpcklpd_avx(auVar9,auVar10);
          auVar9 = vunpckhpd_avx(auVar9,auVar10);
          auVar42._16_16_ = auVar13._0_16_;
          auVar42._0_16_ = auVar11._0_16_;
          auVar43._16_16_ = auVar8._0_16_;
          auVar43._0_16_ = auVar6._0_16_;
          auVar44._16_16_ = auVar22._0_16_;
          auVar44._0_16_ = auVar12._0_16_;
          auVar45._16_16_ = auVar9._0_16_;
          auVar45._0_16_ = auVar7._0_16_;
          auVar10 = vperm2f128_avx(auVar11,auVar13,0x31);
          auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
          auVar8 = vperm2f128_avx(auVar12,auVar22,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36) = auVar42;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0x20) = auVar43;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0x40) = auVar44;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0x60) = auVar45;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0x80) = auVar10;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0xa0) = auVar6;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0xc0) = auVar8;
          *(undefined1 (*) [32])((long)pvVar16 + lVar41 * 8 + lVar36 + 0xe0) = auVar7;
          puVar33 = puVar33 + 0x40;
          lVar41 = lVar41 + 0x20;
          lVar29 = lVar29 + 8;
        }
        lVar38 = local_d8 * lVar38;
        for (; (int)lVar29 < _w; lVar29 = lVar29 + 1) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar29 * 4 + lVar38 * uVar32);
          *puVar33 = *puVar1;
          puVar33[1] = *(undefined4 *)((long)puVar1 + lVar38);
          puVar33[2] = *(undefined4 *)((long)puVar1 + lVar38 * 2);
          puVar33[3] = *(undefined4 *)((long)puVar1 + lVar38 * 3);
          puVar33[4] = puVar1[lVar38];
          puVar33[5] = *(undefined4 *)((long)puVar1 + lVar38 * 5);
          puVar33[6] = *(undefined4 *)((long)puVar1 + lVar38 * 6);
          puVar33[7] = *(undefined4 *)((long)puVar1 + lVar38 * 7);
          puVar33 = puVar33 + 8;
        }
        lVar27 = lVar27 + 8;
        lVar39 = lVar39 + 8;
        lVar31 = lVar31 + 8;
        lVar28 = lVar28 + 8;
        lVar30 = lVar30 + 8;
        lVar37 = lVar37 + 8;
        lVar34 = lVar34 + 8;
        lVar35 = lVar35 + 1;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_002bd42e;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_002bd42e;
      if (local_c8 != (Allocator *)0x0) {
        (*local_c8->_vptr_Allocator[3])();
        goto LAB_002bd42e;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002bcda0;
      Mat::reshape((Mat *)&pd,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      lVar27 = 1;
      lVar39 = 2;
      lVar31 = 3;
      lVar28 = 0;
      for (uVar32 = 0; (long)(uVar32 | 3) < (long)uVar40; uVar32 = uVar32 + 4) {
        lVar34 = (long)(this->weight_data_tm).w;
        pvVar16 = (this->weight_data_tm).data;
        sVar18 = (this->weight_data_tm).elemsize;
        puVar33 = (undefined4 *)((uVar32 >> 2) * lVar34 * sVar18 + (long)pvVar16);
        lVar37 = (long)local_bc;
        lVar34 = sVar18 * lVar28 * lVar34;
        lVar35 = local_d8 * uVar32 * lVar37;
        lVar36 = local_d8 * lVar27 * lVar37;
        lVar30 = local_d8 * lVar39 * lVar37;
        lVar37 = local_d8 * lVar31 * lVar37;
        lVar41 = 0;
        lVar38 = 0;
        for (iVar25 = 0; iVar25 + 3 < _w; iVar25 = iVar25 + 4) {
          auVar2 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar38 + lVar35);
          auVar3 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar38 + lVar36);
          auVar4 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar38 + lVar30);
          auVar5 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar38 + lVar37);
          auVar20 = vunpcklps_avx(auVar2,auVar3);
          auVar21 = vunpcklps_avx(auVar4,auVar5);
          auVar19 = vunpckhps_avx(auVar2,auVar3);
          auVar5 = vunpckhps_avx(auVar4,auVar5);
          auVar2 = vmovlhps_avx(auVar20,auVar21);
          auVar4 = vunpckhpd_avx(auVar20,auVar21);
          auVar3 = vmovlhps_avx(auVar19,auVar5);
          auVar5 = vunpckhpd_avx(auVar19,auVar5);
          *(undefined1 (*) [16])((long)pvVar16 + lVar38 * 4 + lVar34) = auVar2;
          *(undefined1 (*) [16])((long)pvVar16 + lVar38 * 4 + lVar34 + 0x10) = auVar4;
          *(undefined1 (*) [16])((long)pvVar16 + lVar38 * 4 + lVar34 + 0x20) = auVar3;
          *(undefined1 (*) [16])((long)pvVar16 + lVar38 * 4 + lVar34 + 0x30) = auVar5;
          puVar33 = puVar33 + 0x10;
          lVar38 = lVar38 + 0x10;
          lVar41 = lVar41 + 4;
        }
        for (; (int)lVar41 < _w; lVar41 = lVar41 + 1) {
          *puVar33 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar41 * 4 + lVar35);
          puVar33[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar41 * 4 + lVar36);
          puVar33[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar41 * 4 + lVar30);
          puVar33[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar41 * 4 + lVar37);
          puVar33 = puVar33 + 4;
        }
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 4;
        lVar39 = lVar39 + 4;
        lVar31 = lVar31 + 4;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_002bd42e;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_002bd42e;
      if (local_c8 != (Allocator *)0x0) {
        (*local_c8->_vptr_Allocator[3])();
        goto LAB_002bd42e;
      }
    }
    free(pd._vptr_ParamDict);
  }
  else {
LAB_002bcda0:
    if (p_Var14 != (_func_int *)0xfffffffffffffee0) {
      piVar15 = *(int **)(&this->field_0x138 + (long)p_Var14);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      piVar15 = (this->weight_data_tm).refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pvVar16 = (this->weight_data_tm).data;
          pAVar17 = (this->weight_data_tm).allocator;
          if (pAVar17 == (Allocator *)0x0) {
            free(pvVar16);
          }
          else {
            (*pAVar17->_vptr_Allocator[3])
                      (pAVar17,pvVar16,(long)iVar25 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      piVar15 = *(int **)(&this->field_0x138 + (long)p_Var14);
      (this->weight_data_tm).data = this_01->data;
      (this->weight_data_tm).refcount = piVar15;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var14);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var14);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var14);
      uVar23 = *(undefined8 *)(&this->field_0x158 + (long)p_Var14);
      uVar24 = *(undefined8 *)(&this->field_0x160 + (long)p_Var14);
      (this->weight_data_tm).dims = (int)uVar23;
      (this->weight_data_tm).w = (int)((ulong)uVar23 >> 0x20);
      (this->weight_data_tm).h = (int)uVar24;
      (this->weight_data_tm).d = (int)((ulong)uVar24 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var14);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var14);
    }
  }
LAB_002bd42e:
  if (opt->lightmode == true) {
    p_Var14 = this->_vptr_InnerProduct_x86_avx[-3];
    piVar15 = *(int **)(&this->field_0x138 + (long)p_Var14);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var14) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var14));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var14) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var14) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var14) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}